

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O0

bool __thiscall
iDynTree::KinDynComputations::setRobotState
          (KinDynComputations *this,Span<const_double,__1L> s,Span<const_double,__1L> s_dot,
          Span<const_double,__1L> world_gravity)

{
  Span<const_double,__1L> vec;
  bool bVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  extent_type<_1L> in_RDI;
  undefined8 in_R8;
  Vector3 *in_stack_00000080;
  VectorDynSize *in_stack_00000088;
  Twist *in_stack_00000090;
  VectorDynSize *in_stack_00000098;
  Transform *in_stack_000000a0;
  KinDynComputations *in_stack_000000a8;
  Twist base_velocity;
  Transform world_T_base;
  VectorFixSize<3U> *this_00;
  SpatialMotionVector *pSVar2;
  VectorDynSize local_138 [32];
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  VectorDynSize local_108 [32];
  SpatialMotionVector local_e8;
  Twist local_b8 [152];
  undefined8 local_20;
  undefined8 uStack_18;
  undefined8 local_10;
  undefined8 uStack_8;
  
  this_00 = (VectorFixSize<3U> *)&stack0x00000008;
  local_20 = in_RCX;
  uStack_18 = in_R8;
  local_10 = in_RSI;
  uStack_8 = in_RDX;
  iDynTree::Transform::Identity();
  pSVar2 = &local_e8;
  SpatialVector<iDynTree::SpatialMotionVector>::Zero();
  iDynTree::Twist::Twist(local_b8,pSVar2);
  local_118 = (undefined4)local_10;
  uStack_114 = local_10._4_4_;
  uStack_110 = (undefined4)uStack_8;
  uStack_10c = uStack_8._4_4_;
  iDynTree::VectorDynSize::VectorDynSize(local_108,local_10,uStack_8);
  iDynTree::VectorDynSize::VectorDynSize(local_138,local_20,uStack_18);
  vec.storage_.data_ = (pointer)pSVar2;
  vec.storage_.super_extent_type<_1L>.size_ = in_RDI.size_;
  VectorFixSize<3U>::VectorFixSize(this_00,vec);
  bVar1 = setRobotState(in_stack_000000a8,in_stack_000000a0,in_stack_00000098,in_stack_00000090,
                        in_stack_00000088,in_stack_00000080);
  iDynTree::VectorDynSize::~VectorDynSize(local_138);
  iDynTree::VectorDynSize::~VectorDynSize(local_108);
  return bVar1;
}

Assistant:

bool KinDynComputations::setRobotState(Span<const double> s,
                                       Span<const double> s_dot,
                                       Span<const double> world_gravity)
{
    Transform world_T_base = Transform::Identity();
    Twist base_velocity = Twist::Zero();

    return setRobotState(world_T_base, s,
                         base_velocity, s_dot,
                         world_gravity);
}